

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.cpp
# Opt level: O1

int duckdb::NumericHelper::UnsignedLength<unsigned_long>(uint64_t value)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((char *)(value >> 10) <
      "rINS_10unique_ptrINS_10ExpressionESt14default_deleteIS6_ELb1EEELb1EEE") {
    if (value < 100000) {
      uVar2 = 2 - (value < 10);
      uVar3 = 9999;
      uVar4 = 999;
      pcVar1 = (char *)0x63;
    }
    else {
      uVar2 = 7 - (value < 1000000);
      uVar3 = 999999999;
      uVar4 = 99999999;
      pcVar1 = "redRowGroupE";
    }
  }
  else if (value < 1000000000000000) {
    uVar2 = 0xc - (value >> 0xb < 0x2e90edd);
    uVar3 = 99999999999999;
    uVar4 = 9999999999999;
    pcVar1 = (char *)0xe8d4a50fff;
  }
  else {
    uVar2 = 9999999999999999 < value | 0x10;
    uVar3 = 9999999999999999999;
    uVar4 = 999999999999999999;
    pcVar1 = (char *)0x16345785d89ffff;
  }
  return (uint)(uVar4 < value) + uVar2 + (pcVar1 < value) + (uint)(uVar3 < value);
}

Assistant:

int NumericHelper::UnsignedLength(uint64_t value) {
	if (value >= 10000000000ULL) {
		if (value >= 1000000000000000ULL) {
			int length = 16;
			length += value >= 10000000000000000ULL;
			length += value >= 100000000000000000ULL;
			length += value >= 1000000000000000000ULL;
			length += value >= 10000000000000000000ULL;
			return length;
		} else {
			int length = 11;
			length += value >= 100000000000ULL;
			length += value >= 1000000000000ULL;
			length += value >= 10000000000000ULL;
			length += value >= 100000000000000ULL;
			return length;
		}
	} else {
		if (value >= 100000ULL) {
			int length = 6;
			length += value >= 1000000ULL;
			length += value >= 10000000ULL;
			length += value >= 100000000ULL;
			length += value >= 1000000000ULL;
			return length;
		} else {
			int length = 1;
			length += value >= 10ULL;
			length += value >= 100ULL;
			length += value >= 1000ULL;
			length += value >= 10000ULL;
			return length;
		}
	}
}